

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O0

JsErrorCode __thiscall AutoString::Initialize(AutoString *this,JsValueRef value)

{
  JsErrorCode JVar1;
  char *pcVar2;
  PAL_FILE *pPVar3;
  size_t local_38;
  size_t writtenLength;
  size_t length;
  JsValueRef pvStack_20;
  JsValueType type;
  JsValueRef strValue;
  JsValueRef value_local;
  AutoString *this_local;
  
  this->errorCode = JsNoError;
  strValue = value;
  value_local = this;
  ChakraRTInterface::JsGetValueType(value,(JsValueType *)((long)&length + 4));
  if (length._4_4_ == 3) {
    pvStack_20 = strValue;
  }
  else {
    JVar1 = ChakraRTInterface::JsConvertValueToString(strValue,&stack0xffffffffffffffe0);
    this->errorCode = JVar1;
  }
  writtenLength = 0;
  if (this->errorCode == JsNoError) {
    JVar1 = ChakraRTInterface::JsCopyString(pvStack_20,(char *)0x0,0,&writtenLength);
    this->errorCode = JVar1;
    if (this->errorCode == JsNoError) {
      pcVar2 = (char *)malloc(writtenLength + 1);
      this->data = pcVar2;
      local_38 = 0;
      JVar1 = ChakraRTInterface::JsCopyString(pvStack_20,this->data,writtenLength,&local_38);
      this->errorCode = JVar1;
      if ((this->errorCode == JsNoError) && (writtenLength != local_38)) {
        pPVar3 = PAL_get_stderr(0);
        PAL_fprintf(pPVar3,"ASSERTION (%s, line %d) %s %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/stdafx.h"
                    ,0xe0,"length == writtenLength","Inconsistent length in utf8 encoding");
        pPVar3 = PAL_get_stderr(0);
        PAL_fflush(pPVar3);
        DebugBreak();
      }
    }
  }
  if (this->errorCode == JsNoError) {
    this->data[writtenLength] = '\0';
    this->length = writtenLength;
  }
  return this->errorCode;
}

Assistant:

JsErrorCode Initialize(JsValueRef value)
    {
        errorCode = JsNoError;
        JsValueRef strValue;
        JsValueType type;
        ChakraRTInterface::JsGetValueType(value, &type);
        if (type != JsString)
        {
            errorCode = ChakraRTInterface::JsConvertValueToString(value, &strValue);
        }
        else
        {
            strValue = value;
        }
        size_t length = 0;
        if (errorCode == JsNoError)
        {
            errorCode = ChakraRTInterface::JsCopyString(strValue, nullptr, 0, &length);
            if (errorCode == JsNoError)
            {
                data = (char*)malloc((length + 1) * sizeof(char));
                size_t writtenLength = 0;
                errorCode = ChakraRTInterface::JsCopyString(strValue, data, length, &writtenLength);
                if (errorCode == JsNoError)
                {
                    AssertMsg(length == writtenLength, "Inconsistent length in utf8 encoding");
                }
            }
        }
        if (errorCode == JsNoError)
        {
            *(data + length) = char(0);
            this->length = length;
        }
        return errorCode;
    }